

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

bool __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::dump_to_stream
          (array_n<float,_3,_std::allocator<float>_> *this,ofstream *stream)

{
  int iVar1;
  uint sig;
  undefined4 local_2c;
  
  iVar1 = *(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
  if (iVar1 == 0) {
    local_2c = 0x53534c41;
    std::ostream::write((char *)stream,(long)&local_2c);
    std::ostream::write((char *)stream,(long)this->_dims);
    std::ostream::write((char *)stream,(long)this->_array);
  }
  return iVar1 == 0;
}

Assistant:

bool dump_to_stream(std::ofstream &stream) const {
            if(!stream.good()) return false;

            unsigned int sig = 0x53534c41; // TODO: Move this sig out into a DEFINE

            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            stream.write((const char *)&sig, sizeof(unsigned int));
            stream.write((const char *)&_dims[0], N*sizeof(unsigned int));
            stream.write((const char *)_array, size*sizeof(T));

            return true;
        }